

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obuf.c
# Opt level: O2

size_t obuf_dup(obuf *buf,void *data,size_t size)

{
  iovec *piVar1;
  int iVar2;
  size_t size_00;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong __n;
  bool bVar6;
  
  iVar2 = buf->pos;
  size_00 = size;
  do {
    uVar4 = buf->capacity[iVar2];
    piVar1 = buf->iov + iVar2;
    uVar5 = buf->iov[iVar2].iov_len;
    if (uVar5 + size_00 <= uVar4) {
LAB_00103fc5:
      memcpy((void *)(uVar5 + (long)piVar1->iov_base),data,size_00);
      uVar4 = piVar1->iov_len + size_00;
      piVar1->iov_len = uVar4;
      buf->used = buf->used + size_00;
      if (uVar4 <= buf->capacity[buf->pos]) {
        return size;
      }
      __assert_fail("iov->iov_len <= buf->capacity[buf->pos]",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/obuf.c"
                    ,0xa9,"size_t obuf_dup(struct obuf *, const void *, size_t)");
    }
    __n = uVar4 - uVar5;
    if (uVar4 < uVar5 || __n == 0) {
      if (uVar4 == 0) {
        pvVar3 = obuf_alloc_pos(buf,size_00);
        if (pvVar3 == (void *)0x0) goto LAB_00104010;
        uVar5 = piVar1->iov_len;
        goto LAB_00103fc5;
      }
    }
    else {
      bVar6 = size_00 < __n;
      size_00 = size_00 - __n;
      if (bVar6 || size_00 == 0) {
        __assert_fail("fill < to_copy",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/obuf.c"
                      ,0x86,"size_t obuf_dup(struct obuf *, const void *, size_t)");
      }
      memcpy((void *)(uVar5 + (long)piVar1->iov_base),data,__n);
      uVar5 = piVar1->iov_len + __n;
      piVar1->iov_len = uVar5;
      buf->used = buf->used + __n;
      data = (void *)((long)data + __n);
    }
    if (uVar4 != uVar5) {
      __assert_fail("capacity == iov->iov_len",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/obuf.c"
                    ,0x9f,"size_t obuf_dup(struct obuf *, const void *, size_t)");
    }
    if (0x1d < buf->pos) {
LAB_00104010:
      return size - size_00;
    }
    iVar2 = buf->pos + 1;
    buf->pos = iVar2;
  } while( true );
}

Assistant:

size_t
obuf_dup(struct obuf *buf, const void *data, size_t size)
{
	struct iovec *iov = &buf->iov[buf->pos];
	size_t capacity = buf->capacity[buf->pos];
	size_t to_copy = size;
	/**
	 * @pre buf->pos points at an array of allocated buffers.
	 * The array ends with a zero-initialized buffer.
	 */
	while (iov->iov_len + to_copy > capacity) {
		/*
		 * The data doesn't fit into this buffer.
		 * It could be because the buffer is not
		 * allocated, is partially or completely full.
		 * Copy as much as possible into already
		 * allocated buffers.
		 */
		if (iov->iov_len < capacity) {
			/*
			 * This buffer is allocated, but can't
			 * fit all the data. Copy as much data as
			 * possible.
			 */
			size_t fill = capacity - iov->iov_len;
			assert(fill < to_copy);
			memcpy((char *) iov->iov_base + iov->iov_len,
			       data, fill);

			iov->iov_len += fill;
			buf->used += fill;
			data = (char *) data + fill;
			to_copy -= fill;
			/*
			 * Check if the remainder can fit
			 * without allocations.
			 */
		} else if (capacity == 0) {
			/**
			 * Still some data to copy. We have to get
			 * a new buffer. Before we allocate
			 * a buffer for this position, ensure
			 * there is an unallocated buffer in the
			 * next one, since it works as an end
			 * marker for the loop above.
			 */
			if (obuf_alloc_pos(buf, to_copy) == NULL)
				return size - to_copy;
			break;
		}
		assert(capacity == iov->iov_len);
		if (buf->pos + 1 >= SMALL_OBUF_IOV_MAX)
			return size - to_copy;
		buf->pos++;
		iov = &buf->iov[buf->pos];
		capacity = buf->capacity[buf->pos];
	}
	memcpy((char *) iov->iov_base + iov->iov_len, data, to_copy);
	iov->iov_len += to_copy;
	buf->used += to_copy;
	assert(iov->iov_len <= buf->capacity[buf->pos]);
	return size;
}